

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unit_file_tests.cpp
# Opt level: O3

void __thiscall
iu_StdFileUnitTest_x_iutest_x_ReadWrite_Test::Body
          (iu_StdFileUnitTest_x_iutest_x_ReadWrite_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  size_t sVar3;
  char *in_R9;
  unsigned_long *actual;
  AssertionResult iutest_ar;
  char wbuf [17];
  FilePath filename;
  char rbuf [32];
  type **in_stack_fffffffffffffd58;
  allocator<char> local_299;
  AssertionResult local_298;
  AssertionHelper local_270;
  string local_240;
  StdioFile local_220;
  char local_208 [32];
  iuFilePath local_1e8;
  char local_1c8 [32];
  undefined1 local_1a8 [392];
  
  builtin_strncpy(local_208,"test1234abcdWXYZ",0x11);
  local_1c8[0x10] = '\0';
  local_1c8[0x11] = '\0';
  local_1c8[0x12] = '\0';
  local_1c8[0x13] = '\0';
  local_1c8[0x14] = '\0';
  local_1c8[0x15] = '\0';
  local_1c8[0x16] = '\0';
  local_1c8[0x17] = '\0';
  local_1c8[0x18] = '\0';
  local_1c8[0x19] = '\0';
  local_1c8[0x1a] = '\0';
  local_1c8[0x1b] = '\0';
  local_1c8[0x1c] = '\0';
  local_1c8[0x1d] = '\0';
  local_1c8[0x1e] = '\0';
  local_1c8[0x1f] = '\0';
  local_1c8[0] = '\0';
  local_1c8[1] = '\0';
  local_1c8[2] = '\0';
  local_1c8[3] = '\0';
  local_1c8[4] = '\0';
  local_1c8[5] = '\0';
  local_1c8[6] = '\0';
  local_1c8[7] = '\0';
  local_1c8[8] = '\0';
  local_1c8[9] = '\0';
  local_1c8[10] = '\0';
  local_1c8[0xb] = '\0';
  local_1c8[0xc] = '\0';
  local_1c8[0xd] = '\0';
  local_1c8[0xe] = '\0';
  local_1c8[0xf] = '\0';
  local_220.super_IFile.super_IOutStream._vptr_IOutStream = (_func_int **)&PTR__StdioFile_00183ef8;
  local_220.super_IFile.super_IInStream._vptr_IInStream = (_func_int **)&PTR__StdioFile_00183f48;
  local_220.m_fp = (FILE *)0x0;
  iutest::detail::iuFilePath::iuFilePath(&local_1e8,"./testdata/unit_file_tests.tmp");
  local_220.m_fp = (FILE *)fopen64(local_1e8.m_path._M_dataplus._M_p,"wb");
  paVar1 = &local_298.m_message.field_2;
  local_298.m_message._M_string_length = 0;
  local_298.m_message.field_2._M_local_buf[0] = '\0';
  local_298.m_result = (FILE *)local_220.m_fp != (FILE *)0x0;
  local_298.m_message._M_dataplus._M_p = (pointer)paVar1;
  if ((FILE *)local_220.m_fp == (FILE *)0x0) {
    memset((iu_global_format_stringstream *)local_1a8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a8);
    iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
              (&local_240,(internal *)&local_298,
               (AssertionResult *)"file.Open(filename.string().c_str(), iutest::IFile::OpenWrite)",
               "false","true",in_R9);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_270,local_240._M_dataplus._M_p,&local_299);
    local_270.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_file_tests.cpp"
    ;
    local_270.m_part_result.super_iuCodeMessage.m_line = 0x35;
    local_270.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_270,(Fixed *)local_1a8,false);
LAB_00146170:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_270.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                    (uint)local_270.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p) !=
        &local_270.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_270.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                               _M_p._4_4_,
                               (uint)local_270.m_part_result.super_iuCodeMessage.m_message.
                                     _M_dataplus._M_p),
                      local_270.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p != &local_240.field_2) {
LAB_0014619e:
      operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_298.m_result = iutest::StdioFile::Write(&local_220,local_208,4,4);
    local_298.m_message._M_string_length = 0;
    local_298.m_message.field_2._M_local_buf[0] = '\0';
    if (!local_298.m_result) {
      local_298.m_message._M_dataplus._M_p = (pointer)paVar1;
      memset((iu_global_format_stringstream *)local_1a8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a8);
      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                (&local_240,(internal *)&local_298,(AssertionResult *)"file.Write(wbuf, 4, 4)",
                 "false","true",in_R9);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_270,local_240._M_dataplus._M_p,&local_299);
      local_270.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_file_tests.cpp"
      ;
      local_270.m_part_result.super_iuCodeMessage.m_line = 0x36;
      local_270.m_part_result.super_iuCodeMessage._44_4_ = 2;
      iutest::AssertionHelper::OnFixed(&local_270,(Fixed *)local_1a8,false);
      goto LAB_00146170;
    }
    local_298.m_message._M_dataplus._M_p = (pointer)paVar1;
    iVar2 = (*local_220.super_IFile.super_IOutStream._vptr_IOutStream[5])
                      (&local_220,local_1e8.m_path._M_dataplus._M_p,1);
    local_298.m_message._M_string_length = 0;
    local_298.m_message.field_2._M_local_buf[0] = '\0';
    local_298.m_result = SUB41(iVar2,0);
    if (local_298.m_result == false) {
      local_298.m_message._M_dataplus._M_p = (pointer)paVar1;
      memset((iu_global_format_stringstream *)local_1a8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a8);
      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                (&local_240,(internal *)&local_298,
                 (AssertionResult *)"file.Open(filename.string().c_str(), iutest::IFile::OpenRead)",
                 "false","true",in_R9);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_270,local_240._M_dataplus._M_p,&local_299);
      local_270.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_file_tests.cpp"
      ;
      local_270.m_part_result.super_iuCodeMessage.m_line = 0x37;
      local_270.m_part_result.super_iuCodeMessage._44_4_ = 2;
      iutest::AssertionHelper::OnFixed(&local_270,(Fixed *)local_1a8,false);
      goto LAB_00146170;
    }
    local_298.m_message._M_dataplus._M_p = (pointer)paVar1;
    sVar3 = fread(local_1c8,4,4,(FILE *)local_220.m_fp);
    local_298.m_result = sVar3 >= 4;
    local_298.m_message._M_string_length = 0;
    local_298.m_message.field_2._M_local_buf[0] = '\0';
    if (sVar3 < 4) {
      local_298.m_message._M_dataplus._M_p = (pointer)paVar1;
      memset((iu_global_format_stringstream *)local_1a8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a8);
      iutest::internal::GetBooleanAssertionFailureMessage_abi_cxx11_
                (&local_240,(internal *)&local_298,(AssertionResult *)"file.Read(rbuf, 4, 4)",
                 "false","true",in_R9);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_270,local_240._M_dataplus._M_p,&local_299);
      local_270.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_file_tests.cpp"
      ;
      local_270.m_part_result.super_iuCodeMessage.m_line = 0x38;
      local_270.m_part_result.super_iuCodeMessage._44_4_ = 2;
      iutest::AssertionHelper::OnFixed(&local_270,(Fixed *)local_1a8,false);
      goto LAB_00146170;
    }
    actual = &iutest_type_traits::enabler_t<void>::value;
    local_298.m_message._M_dataplus._M_p = (pointer)paVar1;
    iutest::internal::CmpHelperSTREQ<char*,char*>
              (&local_298,(internal *)"wbuf","rbuf",local_208,local_1c8,
               (char *)&iutest_type_traits::enabler_t<void>::value,in_stack_fffffffffffffd58);
    if (local_298.m_result == false) {
      memset((iu_global_format_stringstream *)local_1a8,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_1a8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_270,local_298.m_message._M_dataplus._M_p,
                 (allocator<char> *)&local_240);
      local_270.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_file_tests.cpp"
      ;
      local_270.m_part_result.super_iuCodeMessage.m_line = 0x39;
      local_270.m_part_result.super_iuCodeMessage._44_4_ = 1;
      iutest::AssertionHelper::OnFixed(&local_270,(Fixed *)local_1a8,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_270.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                      (uint)local_270.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p)
          != &local_270.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_270.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                 _M_p._4_4_,
                                 (uint)local_270.m_part_result.super_iuCodeMessage.m_message.
                                       _M_dataplus._M_p),
                        local_270.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
      std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_298.m_message._M_dataplus._M_p,
                      CONCAT71(local_298.m_message.field_2._M_allocated_capacity._1_7_,
                               local_298.m_message.field_2._M_local_buf[0]) + 1);
    }
    local_270.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = 0;
    local_1a8._0_8_ = iutest::StdioFile::GetSize(local_220.m_fp);
    if ((ulong)(uint)local_270.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p <
        (ulong)local_1a8._0_8_) {
      local_298.m_message._M_string_length = 0;
      local_298.m_message.field_2._M_local_buf[0] = '\0';
      local_298.m_result = true;
      local_298.m_message._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      actual = (unsigned_long *)local_1a8;
      iutest::internal::CmpHelperOpFailure<unsigned_int,unsigned_long>
                (&local_298,(internal *)"0u","file.GetSize()","<",(char *)&local_270,(uint *)actual,
                 (unsigned_long *)in_stack_fffffffffffffd58);
      if ((local_298.m_result & 1U) == 0) {
        memset((iu_global_format_stringstream *)local_1a8,0,0x188);
        iutest::iu_global_format_stringstream::iu_global_format_stringstream
                  ((iu_global_format_stringstream *)local_1a8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_270,local_298.m_message._M_dataplus._M_p,
                   (allocator<char> *)&local_240);
        local_270.m_part_result.super_iuCodeMessage.m_file =
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_file_tests.cpp"
        ;
        local_270.m_part_result.super_iuCodeMessage.m_line = 0x3a;
        local_270.m_part_result.super_iuCodeMessage._44_4_ = 1;
        iutest::AssertionHelper::OnFixed(&local_270,(Fixed *)local_1a8,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT44(local_270.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_
                        ,(uint)local_270.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                               _M_p) !=
            &local_270.m_part_result.super_iuCodeMessage.m_message.field_2) {
          operator_delete((undefined1 *)
                          CONCAT44(local_270.m_part_result.super_iuCodeMessage.m_message._M_dataplus
                                   ._M_p._4_4_,
                                   (uint)local_270.m_part_result.super_iuCodeMessage.m_message.
                                         _M_dataplus._M_p),
                          local_270.m_part_result.super_iuCodeMessage.m_message.field_2.
                          _M_allocated_capacity + 1);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
        std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
      }
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_298.m_message._M_dataplus._M_p,
                      CONCAT71(local_298.m_message.field_2._M_allocated_capacity._1_7_,
                               local_298.m_message.field_2._M_local_buf[0]) + 1);
    }
    local_270.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = 0;
    local_1a8._0_8_ = 0;
    iutest::internal::CmpHelperEQ<unsigned_int,unsigned_long>
              (&local_298,(internal *)"0u","::iutest::StdioFile::GetSize(__null)",(char *)&local_270
               ,(uint *)local_1a8,actual);
    if (local_298.m_result != false) goto LAB_001461c7;
    memset((iu_global_format_stringstream *)local_1a8,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_270,local_298.m_message._M_dataplus._M_p,
               (allocator<char> *)&local_240);
    local_270.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/unit_file_tests.cpp"
    ;
    local_270.m_part_result.super_iuCodeMessage.m_line = 0x3b;
    local_270.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_270,(Fixed *)local_1a8,false);
    local_240._M_dataplus._M_p =
         (pointer)CONCAT44(local_270.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p.
                           _4_4_,(uint)local_270.m_part_result.super_iuCodeMessage.m_message.
                                       _M_dataplus._M_p);
    local_240.field_2._M_allocated_capacity =
         local_270.m_part_result.super_iuCodeMessage.m_message.field_2._M_allocated_capacity;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240._M_dataplus._M_p !=
        &local_270.m_part_result.super_iuCodeMessage.m_message.field_2) goto LAB_0014619e;
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1a8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x80));
LAB_001461c7:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_298.m_message._M_dataplus._M_p,
                    CONCAT71(local_298.m_message.field_2._M_allocated_capacity._1_7_,
                             local_298.m_message.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8.m_path._M_dataplus._M_p != &local_1e8.m_path.field_2) {
    operator_delete(local_1e8.m_path._M_dataplus._M_p,
                    local_1e8.m_path.field_2._M_allocated_capacity + 1);
  }
  local_220.super_IFile.super_IOutStream._vptr_IOutStream = (_func_int **)&PTR__StdioFile_00183ef8;
  local_220.super_IFile.super_IInStream._vptr_IInStream = (_func_int **)&PTR__StdioFile_00183f48;
  if ((FILE *)local_220.m_fp != (FILE *)0x0) {
    fclose((FILE *)local_220.m_fp);
  }
  return;
}

Assistant:

IUTEST(StdFileUnitTest, ReadWrite)
{
    char wbuf[] = "test1234abcdWXYZ";
    char rbuf[32] = { 0 };
    ::iutest::StdioFile file;
    ::iutest::internal::FilePath filename("./testdata/unit_file_tests.tmp");
    IUTEST_ASSERT_TRUE( file.Open(filename.string().c_str(), iutest::IFile::OpenWrite) );
    IUTEST_ASSERT_TRUE( file.Write(wbuf, 4, 4));
    IUTEST_ASSERT_TRUE( file.Open(filename.string().c_str(), iutest::IFile::OpenRead) );
    IUTEST_ASSERT_TRUE( file.Read(rbuf, 4, 4));
    IUTEST_EXPECT_STREQ(wbuf, rbuf);
    IUTEST_EXPECT_LT(0u, file.GetSize());
    IUTEST_EXPECT_EQ(0u, ::iutest::StdioFile::GetSize(NULL));
}